

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O3

void __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::save
          (segment_impl<ELFIO::Elf32_Phdr> *this,ostream *f,streampos header_offset,
          streampos data_offset)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)data_offset._M_off;
  uVar1 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  if (this->convertor->need_conversion == false) {
    uVar1 = uVar2;
  }
  (this->ph).p_offset = uVar1;
  std::ostream::seekp(f,header_offset._M_off,header_offset._M_state,header_offset._M_state,
                      data_offset._M_off,data_offset._M_state);
  std::ostream::write((char *)f,(long)&this->ph);
  return;
}

Assistant:

void save( std::ostream&  f,
               std::streampos header_offset,
               std::streampos data_offset )
    {
        ph.p_offset = data_offset;
        ph.p_offset = (*convertor)(ph.p_offset);
        f.seekp( header_offset );
        f.write( reinterpret_cast<const char*>( &ph ), sizeof( ph ) );
    }